

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Color ColorTint(Color color,Color tint)

{
  return (Color)(((((uint)tint >> 0x18) * ((uint)color >> 0x18)) / 0xff << 0x18 |
                  ((((uint)tint >> 0x10 & 0xff) * ((uint)color >> 0x10 & 0xff)) / 0xff & 0xff) <<
                  0x10 | ((((uint)tint >> 8 & 0xff) * ((uint)color >> 8 & 0xff)) / 0xff & 0xff) << 8
                 ) + (((uint)tint & 0xff) * ((uint)color & 0xff)) / 0xff);
}

Assistant:

Color ColorTint(Color color, Color tint)
{
    Color result = color;

    unsigned char r = (unsigned char)(((int)color.r*(int)tint.r)/255);
    unsigned char g = (unsigned char)(((int)color.g*(int)tint.g)/255);
    unsigned char b = (unsigned char)(((int)color.b*(int)tint.b)/255);
    unsigned char a = (unsigned char)(((int)color.a*(int)tint.a)/255);

    result.r = r;
    result.g = g;
    result.b = b;
    result.a = a;

    return result;
}